

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void do_xrstor_sse(CPUX86State *env,target_ulong ptr,uintptr_t ra)

{
  target_ulong ptr_00;
  byte bVar1;
  uint64_t uVar2;
  long lVar3;
  
  bVar1 = *(byte *)((long)&env->hflags + 1);
  for (lVar3 = 0; (ulong)(bVar1 & 0xffffff80) + 0x80 != lVar3; lVar3 = lVar3 + 0x10) {
    ptr_00 = ptr + 0xa0 + lVar3;
    uVar2 = cpu_ldq_data_ra_x86_64(env,ptr_00,ra);
    *(uint64_t *)((long)env->xmm_regs + lVar3 * 4) = uVar2;
    uVar2 = cpu_ldq_data_ra_x86_64(env,ptr_00 + 8,ra);
    *(uint64_t *)((long)env->xmm_regs + lVar3 * 4 + 8) = uVar2;
  }
  return;
}

Assistant:

static void do_xrstor_sse(CPUX86State *env, target_ulong ptr, uintptr_t ra)
{
    int i, nb_xmm_regs;
    target_ulong addr;

    if (env->hflags & HF_CS64_MASK) {
        nb_xmm_regs = 16;
    } else {
        nb_xmm_regs = 8;
    }

    addr = ptr + XO(legacy.xmm_regs);
    for (i = 0; i < nb_xmm_regs; i++) {
        env->xmm_regs[i].ZMM_Q(0) = cpu_ldq_data_ra(env, addr, ra);
        env->xmm_regs[i].ZMM_Q(1) = cpu_ldq_data_ra(env, addr + 8, ra);
        addr += 16;
    }
}